

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmInstallTargetGenerator::AddRanlibRule
          (cmInstallTargetGenerator *this,ostream *os,Indent *indent,string *toDestDirPath)

{
  cmMakefile *pcVar1;
  bool bVar2;
  char *pcVar3;
  ostream *poVar4;
  string ranlib;
  allocator local_72;
  allocator local_71;
  string local_70;
  string local_50;
  
  if (this->Target->TargetTypeValue == STATIC_LIBRARY) {
    pcVar1 = this->Target->Makefile;
    std::__cxx11::string::string((string *)&local_70,"APPLE",(allocator *)&local_50);
    bVar2 = cmMakefile::IsOn(pcVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (bVar2) {
      pcVar1 = this->Target->Makefile;
      std::__cxx11::string::string((string *)&local_50,"CMAKE_RANLIB",&local_71);
      pcVar3 = cmMakefile::GetRequiredDefinition(pcVar1,&local_50);
      std::__cxx11::string::string((string *)&local_70,pcVar3,&local_72);
      std::__cxx11::string::~string((string *)&local_50);
      if (local_70._M_string_length != 0) {
        cmScriptGeneratorIndent::Write(indent,os);
        poVar4 = std::operator<<(os,"execute_process(COMMAND \"");
        poVar4 = std::operator<<(poVar4,(string *)&local_70);
        poVar4 = std::operator<<(poVar4,"\" \"");
        poVar4 = std::operator<<(poVar4,(string *)toDestDirPath);
        std::operator<<(poVar4,"\")\n");
      }
      std::__cxx11::string::~string((string *)&local_70);
    }
  }
  return;
}

Assistant:

void
cmInstallTargetGenerator::AddRanlibRule(std::ostream& os,
                                        Indent const& indent,
                                        const std::string& toDestDirPath)
{
  // Static libraries need ranlib on this platform.
  if(this->Target->GetType() != cmTarget::STATIC_LIBRARY)
    {
    return;
    }

  // Perform post-installation processing on the file depending
  // on its type.
  if(!this->Target->GetMakefile()->IsOn("APPLE"))
    {
    return;
    }

  std::string ranlib =
    this->Target->GetMakefile()->GetRequiredDefinition("CMAKE_RANLIB");
  if(ranlib.empty())
    {
    return;
    }

  os << indent << "execute_process(COMMAND \""
     << ranlib << "\" \"" << toDestDirPath << "\")\n";
}